

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseVarList(WastParser *this,VarVector *out_var_list)

{
  bool bVar1;
  Result RVar2;
  Var var;
  long *local_f8 [2];
  long local_e8 [2];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  Var local_c0;
  Var local_78;
  
  Var::Var(&local_c0);
  Var::Var(&local_78);
  bVar1 = ParseVarOpt(this,&local_c0,&local_78);
  Var::~Var(&local_78);
  if (bVar1) {
    do {
      std::vector<wabt::Var,std::allocator<wabt::Var>>::emplace_back<wabt::Var&>
                ((vector<wabt::Var,std::allocator<wabt::Var>> *)out_var_list,&local_c0);
      Var::Var(&local_78);
      bVar1 = ParseVarOpt(this,&local_c0,&local_78);
      Var::~Var(&local_78);
    } while (bVar1);
  }
  RVar2.enum_ = Ok;
  if ((out_var_list->super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (out_var_list->super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"a var","");
    local_d8 = 0;
    uStack_d0 = 0;
    local_c8 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
               local_f8,&local_d8);
    RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_d8,"12 or $foo");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_d8);
    if (local_f8[0] != local_e8) {
      operator_delete(local_f8[0],local_e8[0] + 1);
    }
  }
  Var::~Var(&local_c0);
  return (Result)RVar2.enum_;
}

Assistant:

Result WastParser::ParseVarList(VarVector* out_var_list) {
  WABT_TRACE(ParseVarList);
  Var var;
  while (ParseVarOpt(&var)) {
    out_var_list->emplace_back(var);
  }
  if (out_var_list->empty()) {
    return ErrorExpected({"a var"}, "12 or $foo");
  } else {
    return Result::Ok;
  }
}